

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawRectangleRoundedLines(Rectangle rec,float roundness,int segments,int lineThick,Color color)

{
  Vector2 VVar1;
  Rectangle rec_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_138;
  int local_134;
  int local_130;
  int i_2;
  int i_1;
  Vector2 center_1;
  float angle_1;
  int k_1;
  int i;
  Vector2 center;
  float angle;
  int k;
  float angles [4];
  Vector2 centers [4];
  Vector2 point [16];
  float innerRadius;
  float outerRadius;
  float stepLength;
  float th;
  float radius;
  int local_28;
  int local_24;
  int lineThick_local;
  int segments_local;
  float roundness_local;
  Color color_local;
  Rectangle rec_local;
  
  local_28 = lineThick;
  if (lineThick < 0) {
    local_28 = 0;
  }
  rec_local.y = rec.height;
  roundness_local = rec.x;
  color_local = (Color)rec.y;
  rec_local.x = rec.width;
  if (0.0 < roundness) {
    lineThick_local = (int)roundness;
    if (1.0 <= roundness) {
      lineThick_local = 0x3f800000;
    }
    fVar2 = rec_local.x;
    if (rec_local.y < rec_local.x) {
      fVar2 = rec_local.y;
    }
    local_138 = (fVar2 * (float)lineThick_local) / 2.0;
    if (0.0 < local_138) {
      local_24 = segments;
      if (segments < 4) {
        fVar2 = powf(1.0 - 0.5 / local_138,2.0);
        fVar2 = acosf(fVar2 + fVar2 + -1.0);
        fVar2 = ceilf(6.2831855 / fVar2);
        local_24 = (int)(fVar2 / 2.0);
        if (local_24 < 1) {
          local_24 = 4;
        }
      }
      fVar2 = 90.0 / (float)local_24;
      fVar3 = local_138 + (float)local_28;
      centers[3].x = roundness_local + local_138;
      centers[3].y = (float)color_local - (float)local_28;
      angles[2] = roundness_local + local_138;
      angles[3] = (float)color_local + local_138;
      centers[0].x = (roundness_local + rec_local.x) - local_138;
      centers[0].y = (float)color_local + local_138;
      centers[1].x = (roundness_local + rec_local.x) - local_138;
      centers[1].y = ((float)color_local + rec_local.y) - local_138;
      centers[2].x = roundness_local + local_138;
      centers[2].y = ((float)color_local + rec_local.y) - local_138;
      _angle = 0x42b4000043340000;
      angles[0] = 0.0;
      angles[1] = 270.0;
      segments_local._0_1_ = color.r;
      segments_local._1_1_ = color.g;
      segments_local._2_1_ = color.b;
      segments_local._3_1_ = color.a;
      if (local_28 < 2) {
        rlCheckRenderBatchLimit(local_24 * 8 + 8);
        rlBegin(1);
        for (center_1.y = 0.0; (int)center_1.y < 4; center_1.y = (float)((int)center_1.y + 1)) {
          center_1.x = (&angle)[(int)center_1.y];
          VVar1 = centers[(long)(int)center_1.y + -1];
          for (local_130 = 0; local_130 < local_24; local_130 = local_130 + 1) {
            rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                       segments_local._3_1_);
            i_2 = (int)VVar1.x;
            fVar4 = sinf(center_1.x * 0.017453292);
            i_1 = (int)VVar1.y;
            fVar5 = cosf(center_1.x * 0.017453292);
            rlVertex2f(fVar4 * fVar3 + (float)i_2,fVar5 * fVar3 + (float)i_1);
            fVar4 = sinf((center_1.x + fVar2) * 0.017453292);
            fVar5 = cosf((center_1.x + fVar2) * 0.017453292);
            rlVertex2f(fVar4 * fVar3 + (float)i_2,fVar5 * fVar3 + (float)i_1);
            center_1.x = fVar2 + center_1.x;
          }
        }
        for (local_134 = 0; local_134 < 8; local_134 = local_134 + 2) {
          rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                     segments_local._3_1_);
          rlVertex2f(centers[(long)local_134 + 3].x,centers[(long)local_134 + 3].y);
          rlVertex2f(centers[(long)(local_134 + 1) + 3].x,centers[(long)(local_134 + 1) + 3].y);
        }
        rlEnd();
      }
      else {
        rlCheckRenderBatchLimit(local_24 * 0x10 + 0x10);
        rlSetTexture(texShapes.id);
        rlBegin(7);
        for (center.y = 0.0; (int)center.y < 4; center.y = (float)((int)center.y + 1)) {
          center.x = (&angle)[(int)center.y];
          VVar1 = centers[(long)(int)center.y + -1];
          for (angle_1 = 0.0; (int)angle_1 < local_24; angle_1 = (float)((int)angle_1 + 1)) {
            rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                       segments_local._3_1_);
            rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                         texShapesRec.y / (float)texShapes.height);
            k_1 = (int)VVar1.x;
            fVar4 = sinf(center.x * 0.017453292);
            i = (int)VVar1.y;
            fVar5 = cosf(center.x * 0.017453292);
            rlVertex2f(fVar4 * local_138 + (float)k_1,fVar5 * local_138 + (float)i);
            rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                         (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
            fVar4 = sinf(center.x * 0.017453292);
            fVar5 = cosf(center.x * 0.017453292);
            rlVertex2f(fVar4 * fVar3 + (float)k_1,fVar5 * fVar3 + (float)i);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                         (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
            fVar4 = sinf((center.x + fVar2) * 0.017453292);
            fVar5 = cosf((center.x + fVar2) * 0.017453292);
            rlVertex2f(fVar4 * fVar3 + (float)k_1,fVar5 * fVar3 + (float)i);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                         texShapesRec.y / (float)texShapes.height);
            fVar4 = sinf((center.x + fVar2) * 0.017453292);
            fVar5 = cosf((center.x + fVar2) * 0.017453292);
            rlVertex2f(fVar4 * local_138 + (float)k_1,fVar5 * local_138 + (float)i);
            center.x = fVar2 + center.x;
          }
        }
        rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                   segments_local._3_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(centers[3].x,centers[3].y);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local + local_138,(float)color_local);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f((roundness_local + rec_local.x) - local_138,(float)color_local);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f((roundness_local + rec_local.x) - local_138,(float)color_local - (float)local_28)
        ;
        rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                   segments_local._3_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(roundness_local + rec_local.x + (float)local_28,(float)color_local + local_138);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local + rec_local.x,(float)color_local + local_138);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local + rec_local.x,((float)color_local + rec_local.y) - local_138);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(roundness_local + rec_local.x + (float)local_28,
                   ((float)color_local + rec_local.y) - local_138);
        rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                   segments_local._3_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(roundness_local + local_138,(float)color_local + rec_local.y);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local + local_138,(float)color_local + rec_local.y + (float)local_28);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f((roundness_local + rec_local.x) - local_138,
                   (float)color_local + rec_local.y + (float)local_28);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f((roundness_local + rec_local.x) - local_138,(float)color_local + rec_local.y);
        rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                   segments_local._3_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(roundness_local,(float)color_local + local_138);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local - (float)local_28,(float)color_local + local_138);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(roundness_local - (float)local_28,((float)color_local + rec_local.y) - local_138)
        ;
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(roundness_local,((float)color_local + rec_local.y) - local_138);
        rlEnd();
        rlSetTexture(0);
      }
    }
  }
  else {
    rec_00.y = (float)color_local - (float)local_28;
    rec_00.x = roundness_local - (float)local_28;
    rec_00.width = rec_local.x + (float)(local_28 * 2);
    rec_00.height = rec_local.y + (float)(local_28 * 2);
    DrawRectangleLinesEx(rec_00,local_28,color);
  }
  return;
}

Assistant:

void DrawRectangleRoundedLines(Rectangle rec, float roundness, int segments, int lineThick, Color color)
{
    if (lineThick < 0) lineThick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        DrawRectangleLinesEx((Rectangle){rec.x-lineThick, rec.y-lineThick, rec.width+2*lineThick, rec.height+2*lineThick}, lineThick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/2.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;
    const float outerRadius = radius + (float)lineThick, innerRadius = radius;

    /*
    Quick sketch to make sense of all of this,
    marks the 16 + 4(corner centers P16-19) points we'll use

           P0 ================== P1
          // P8                P9 \\
         //                        \\
     P7 // P15                  P10 \\ P2
       ||   *P16             P17*    ||
       ||                            ||
       || P14                   P11  ||
     P6 \\  *P19             P18*   // P3
         \\                        //
          \\ P13              P12 //
           P5 ================== P4
    */
    const Vector2 point[16] = {
        {(float)rec.x + innerRadius, rec.y - lineThick}, {(float)(rec.x + rec.width) - innerRadius, rec.y - lineThick}, { rec.x + rec.width + lineThick, (float)rec.y + innerRadius }, // PO, P1, P2
        {rec.x + rec.width + lineThick, (float)(rec.y + rec.height) - innerRadius}, {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height + lineThick}, // P3, P4
        {(float)rec.x + innerRadius, rec.y + rec.height + lineThick}, { rec.x - lineThick, (float)(rec.y + rec.height) - innerRadius}, {rec.x - lineThick, (float)rec.y + innerRadius}, // P5, P6, P7
        {(float)rec.x + innerRadius, rec.y}, {(float)(rec.x + rec.width) - innerRadius, rec.y}, // P8, P9
        { rec.x + rec.width, (float)rec.y + innerRadius }, {rec.x + rec.width, (float)(rec.y + rec.height) - innerRadius}, // P10, P11
        {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height}, {(float)rec.x + innerRadius, rec.y + rec.height}, // P12, P13
        { rec.x, (float)(rec.y + rec.height) - innerRadius}, {rec.x, (float)rec.y + innerRadius} // P14, P15
    };

    const Vector2 centers[4] = {
        {(float)rec.x + innerRadius, (float)rec.y + innerRadius}, {(float)(rec.x + rec.width) - innerRadius, (float)rec.y + innerRadius}, // P16, P17
        {(float)(rec.x + rec.width) - innerRadius, (float)(rec.y + rec.height) - innerRadius}, {(float)rec.x + innerRadius, (float)(rec.y + rec.height) - innerRadius} // P18, P19
    };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (lineThick > 1)
    {
#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlCheckRenderBatchLimit(4*4*segments + 4*4); // 4 corners with 4 vertices for each segment + 4 rectangles with 4 vertices each

        rlSetTexture(texShapes.id);

        rlBegin(RL_QUADS);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];
                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
                    rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);
                    rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[0].x, point[0].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[8].x, point[8].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[9].x, point[9].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[1].x, point[1].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[2].x, point[2].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[10].x, point[10].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[11].x, point[11].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[13].x, point[13].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[5].x, point[5].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[4].x, point[4].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[12].x, point[12].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[15].x, point[15].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[7].x, point[7].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[6].x, point[6].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[14].x, point[14].y);

        rlEnd();
        rlSetTexture(0);
#else
        rlCheckRenderBatchLimit(4*6*segments + 4*6); // 4 corners with 6(2*3) vertices for each segment + 4 rectangles with 6 vertices each

        rlBegin(RL_TRIANGLES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[8].x, point[8].y);
            rlVertex2f(point[9].x, point[9].y);
            rlVertex2f(point[1].x, point[1].y);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[9].x, point[9].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[11].x, point[11].y);
            rlVertex2f(point[3].x, point[3].y);
            rlVertex2f(point[2].x, point[2].y);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[5].x, point[5].y);
            rlVertex2f(point[4].x, point[4].y);
            rlVertex2f(point[12].x, point[12].y);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[4].x, point[4].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[6].x, point[6].y);
            rlVertex2f(point[14].x, point[14].y);
            rlVertex2f(point[15].x, point[15].y);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[14].x, point[14].y);
        rlEnd();
#endif
    }
    else
    {
        // Use LINES to draw the outline
        rlCheckRenderBatchLimit(8*segments + 4*2); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rlBegin(RL_LINES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);
                    angle += stepLength;
                }
            }

            // And now the remaining 4 lines
            for (int i = 0; i < 8; i += 2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(point[i].x, point[i].y);
                rlVertex2f(point[i + 1].x, point[i + 1].y);
            }

        rlEnd();
    }
}